

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lb.cpp
# Opt level: O0

void __thiscall zmq::lb_t::attach(lb_t *this,pipe_t *pipe_)

{
  lb_t *in_RSI;
  pipe_t *in_RDI;
  
  array_t<zmq::pipe_t,_2>::push_back(&this->_pipes,pipe_);
  activated(in_RSI,in_RDI);
  return;
}

Assistant:

void zmq::lb_t::attach (pipe_t *pipe_)
{
    _pipes.push_back (pipe_);
    activated (pipe_);
}